

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::removeTargetFromInterface(CommonCore *this,ActionMessage *command)

{
  BrokerBase *pBVar1;
  bool bVar2;
  GlobalFederateId id;
  GlobalFederateId id_00;
  action_t aVar3;
  GlobalFederateId GVar4;
  FederateState *pFVar5;
  CommonCore *in_RSI;
  CommonCore *in_RDI;
  GlobalFederateId unaff_retaddr;
  FederateState *fed;
  ActionMessage *in_stack_00000448;
  TranslatorFederate *in_stack_00000450;
  ActionMessage *in_stack_00000558;
  FilterFederate *in_stack_00000560;
  atomic<helics::GlobalFederateId> *in_stack_ffffffffffffffb8;
  ActionMessage *action;
  CommonCore *this_00;
  
  pBVar1 = &in_RSI->super_BrokerBase;
  this_00 = in_RDI;
  id = std::atomic::operator_cast_to_GlobalFederateId(in_stack_ffffffffffffffb8);
  bVar2 = GlobalFederateId::operator==((GlobalFederateId *)&pBVar1->global_id,id);
  if (bVar2) {
    FilterFederate::handleMessage(in_stack_00000560,in_stack_00000558);
  }
  else {
    action = (ActionMessage *)&(in_RSI->super_BrokerBase).global_id;
    id_00 = std::atomic::operator_cast_to_GlobalFederateId
                      ((atomic<helics::GlobalFederateId> *)action);
    bVar2 = GlobalFederateId::operator==((GlobalFederateId *)action,id_00);
    if (bVar2) {
      TranslatorFederate::handleMessage(in_stack_00000450,in_stack_00000448);
    }
    else {
      aVar3 = ActionMessage::action((ActionMessage *)in_RSI);
      if (aVar3 == cmd_remove_filter) {
        GVar4 = std::atomic::operator_cast_to_GlobalFederateId
                          ((atomic<helics::GlobalFederateId> *)action);
        (in_RSI->super_BrokerBase).global_id._M_i.gid = GVar4.gid;
        removeTargetFromInterface(in_RSI,(ActionMessage *)CONCAT44(id.gid,id_00.gid));
      }
      else {
        pFVar5 = getFederateCore(this_00,unaff_retaddr);
        if (pFVar5 != (FederateState *)0x0) {
          FederateState::addAction((FederateState *)in_RDI,action);
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::removeTargetFromInterface(ActionMessage& command)
{
    if (command.dest_id == filterFedID) {
        filterFed->handleMessage(command);
    } else if (command.dest_id == translatorFedID) {
        translatorFed->handleMessage(command);
    } else {  // just forward these to the appropriate federate
        if (command.action() == CMD_REMOVE_FILTER) {
            command.dest_id = filterFedID;
            removeTargetFromInterface(command);
        } else {
            auto* fed = getFederateCore(command.dest_id);
            if (fed != nullptr) {
                fed->addAction(command);
            }
        }
    }
}